

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O0

void __thiscall deqp::gls::LifetimeTests::details::LifeTest::testBindNoGen(LifeTest *this)

{
  Type *pTVar1;
  bool bVar2;
  deUint32 name_00;
  int iVar3;
  GLuint GVar4;
  uint uVar5;
  GLenum GVar6;
  TestContext *testCtx;
  Binder *pBVar7;
  undefined1 local_58 [8];
  Name name;
  undefined1 local_30 [4];
  GLuint id;
  ResultCollector errors;
  LifeTest *this_local;
  
  errors.m_message = (char *)this;
  testCtx = tcu::TestNode::getTestContext((TestNode *)this);
  ResultCollector::ResultCollector((ResultCollector *)local_30,testCtx);
  name_00 = de::Random::getUint32(&(this->super_TestBase).m_rnd);
  iVar3 = (*this->m_type->_vptr_Type[4])(this->m_type,(ulong)name_00);
  bVar2 = ResultCollector::check
                    ((ResultCollector *)local_30,(bool)(~(byte)iVar3 & 1),
                     "Randomly chosen identifier already exists");
  if (bVar2) {
    Name::Name((Name *)local_58,this->m_type,name_00);
    pBVar7 = binder(this);
    GVar4 = Name::operator*((Name *)local_58);
    (*pBVar7->_vptr_Binder[2])(pBVar7,(ulong)GVar4);
    pBVar7 = binder(this);
    uVar5 = (*pBVar7->_vptr_Binder[4])();
    if ((uVar5 & 1) == 0) {
      GVar6 = glu::CallLogWrapper::glGetError(&(this->super_TestBase).super_CallLogWrapper);
      ResultCollector::check
                ((ResultCollector *)local_30,GVar6 == 0,
                 "Failed when binding a name not generated by Gen* call");
      pTVar1 = this->m_type;
      GVar4 = Name::operator*((Name *)local_58);
      iVar3 = (*pTVar1->_vptr_Type[4])(pTVar1,(ulong)GVar4);
      ResultCollector::check
                ((ResultCollector *)local_30,(bool)((byte)iVar3 & 1),
                 "Object was not created by the Bind* call");
    }
    else {
      GVar6 = glu::CallLogWrapper::glGetError(&(this->super_TestBase).super_CallLogWrapper);
      ResultCollector::check
                ((ResultCollector *)local_30,GVar6 == 0x502,
                 "Did not fail when binding a name not generated by Gen* call");
      pTVar1 = this->m_type;
      GVar4 = Name::operator*((Name *)local_58);
      iVar3 = (*pTVar1->_vptr_Type[4])(pTVar1,(ulong)GVar4);
      ResultCollector::check
                ((ResultCollector *)local_30,(bool)(~(byte)iVar3 & 1),
                 "Bind* created an object for a name not generated by a Gen* call");
    }
    Name::~Name((Name *)local_58);
    name.m_name = 0;
  }
  else {
    name.m_name = 1;
  }
  ResultCollector::~ResultCollector((ResultCollector *)local_30);
  return;
}

Assistant:

void LifeTest::testBindNoGen (void)
{
	ResultCollector	errors	(getTestContext());
	const GLuint	id		= m_rnd.getUint32();

	if (!errors.check(!m_type.exists(id), "Randomly chosen identifier already exists"))
		return;

	Name			name	(m_type, id);
	binder().bind(*name);

	if (binder().genRequired())
	{
		errors.check(glGetError() == GL_INVALID_OPERATION,
					 "Did not fail when binding a name not generated by Gen* call");
		errors.check(!m_type.exists(*name),
					 "Bind* created an object for a name not generated by a Gen* call");
	}
	else
	{
		errors.check(glGetError() == GL_NO_ERROR,
					 "Failed when binding a name not generated by Gen* call");
		errors.check(m_type.exists(*name),
					 "Object was not created by the Bind* call");
	}
}